

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

bool __thiscall
ON_CurveArray::GetTightBoundingBox
          (ON_CurveArray *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  ON_Curve *pOVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ON_3dPoint local_90;
  ON_3dPoint local_68;
  undefined1 local_50 [8];
  ON_3dPointArray P;
  int i;
  ON_Xform *xform_local;
  bool bGrowBox_local;
  ON_BoundingBox *tight_bbox_local;
  ON_CurveArray *this_local;
  
  if (((this->super_ON_SimpleArray<ON_Curve_*>).m_count == 1) &&
     (*(this->super_ON_SimpleArray<ON_Curve_*>).m_a != (ON_Curve *)0x0)) {
    pOVar1 = *(this->super_ON_SimpleArray<ON_Curve_*>).m_a;
    iVar3 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1a])
                      (pOVar1,tight_bbox,(ulong)bGrowBox,xform);
    this_local._7_1_ = (bool)((byte)iVar3 & 1);
  }
  else {
    xform_local._7_1_ = bGrowBox;
    if ((bGrowBox) && (bVar2 = ON_BoundingBox::IsValid(tight_bbox), !bVar2)) {
      xform_local._7_1_ = 0;
    }
    if ((xform_local._7_1_ & 1) == 0) {
      ON_BoundingBox::Destroy(tight_bbox);
    }
    if (0 < (this->super_ON_SimpleArray<ON_Curve_*>).m_count) {
      ON_3dPointArray::ON_3dPointArray
                ((ON_3dPointArray *)local_50,(this->super_ON_SimpleArray<ON_Curve_*>).m_count << 1);
      for (P.super_ON_SimpleArray<ON_3dPoint>.m_capacity = 0;
          P.super_ON_SimpleArray<ON_3dPoint>.m_capacity <
          (this->super_ON_SimpleArray<ON_Curve_*>).m_count;
          P.super_ON_SimpleArray<ON_3dPoint>.m_capacity =
               P.super_ON_SimpleArray<ON_3dPoint>.m_capacity + 1) {
        if ((this->super_ON_SimpleArray<ON_Curve_*>).m_a
            [P.super_ON_SimpleArray<ON_3dPoint>.m_capacity] != (ON_Curve *)0x0) {
          ON_Curve::PointAtStart
                    (&local_68,
                     (this->super_ON_SimpleArray<ON_Curve_*>).m_a
                     [P.super_ON_SimpleArray<ON_3dPoint>.m_capacity]);
          ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_50,&local_68);
          ON_Curve::PointAtEnd
                    (&local_90,
                     (this->super_ON_SimpleArray<ON_Curve_*>).m_a
                     [P.super_ON_SimpleArray<ON_3dPoint>.m_capacity]);
          ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_50,&local_90);
        }
      }
      bVar2 = ON_3dPointArray::GetTightBoundingBox
                        ((ON_3dPointArray *)local_50,tight_bbox,(bool)(xform_local._7_1_ & 1),xform)
      ;
      if (bVar2) {
        xform_local._7_1_ = 1;
      }
      for (P.super_ON_SimpleArray<ON_3dPoint>.m_capacity = 0;
          P.super_ON_SimpleArray<ON_3dPoint>.m_capacity <
          (this->super_ON_SimpleArray<ON_Curve_*>).m_count;
          P.super_ON_SimpleArray<ON_3dPoint>.m_capacity =
               P.super_ON_SimpleArray<ON_3dPoint>.m_capacity + 1) {
        if (((this->super_ON_SimpleArray<ON_Curve_*>).m_a
             [P.super_ON_SimpleArray<ON_3dPoint>.m_capacity] != (ON_Curve *)0x0) &&
           (pOVar1 = (this->super_ON_SimpleArray<ON_Curve_*>).m_a
                     [P.super_ON_SimpleArray<ON_3dPoint>.m_capacity],
           uVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1a])
                             (pOVar1,tight_bbox,(ulong)(xform_local._7_1_ & 1),xform),
           (uVar4 & 1) != 0)) {
          xform_local._7_1_ = 1;
        }
      }
      ON_3dPointArray::~ON_3dPointArray((ON_3dPointArray *)local_50);
    }
    this_local._7_1_ = (xform_local._7_1_ & 1) != 0;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_CurveArray::GetTightBoundingBox( 
		ON_BoundingBox& tight_bbox, 
    bool bGrowBox,
		const ON_Xform* xform
    ) const
{
  if ( 1 == m_count && m_a[0] )
  {
    return m_a[0]->GetTightBoundingBox(tight_bbox,bGrowBox,xform);
  }

  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }

  if ( m_count > 0 )
  {
    int i;
    // getting box of endpoints tends to help us avoid testing curves
    ON_3dPointArray P(2*m_count);
    for ( i = 0; i < m_count; i++ )
    {
      if ( m_a[i] )
      {
        P.Append( m_a[i]->PointAtStart() );
        P.Append( m_a[i]->PointAtEnd() );
      }
    }
    if ( P.GetTightBoundingBox(tight_bbox,bGrowBox,xform) )
    {
      bGrowBox = true;
    }

    for ( i = 0; i < m_count; i++ )
    {
      if ( m_a[i] )
      {
        if ( m_a[i]->GetTightBoundingBox(tight_bbox,bGrowBox,xform) )
        {
          bGrowBox = true;
        }
      }
    }
  }

  return (0!=bGrowBox);  
}